

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

void Lms_ManPrint(Lms_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int level;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  uVar1 = p->nVars;
  uVar2 = p->vTtMem->nEntries;
  uVar3 = p->nAdded;
  if (p->pGia == (Gia_Man_t *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar4 = Gia_ManAndNum(p->pGia);
    uVar5 = (ulong)uVar4;
  }
  printf("Library with %d vars has %d classes and %d AIG subgraphs with %d AND nodes.\n",
         (ulong)uVar1,(ulong)uVar2,(ulong)uVar3,uVar5);
  Lms_ManPrintFuncStats(p);
  p->nAddedFuncs = p->vTtMem->nEntries;
  dVar6 = 0.0;
  if (p->nTried != 0) {
    dVar6 = (double)p->nTried;
    dVar6 = (dVar6 * 100.0) / dVar6;
  }
  printf("Subgraphs tried                             = %10d. (%6.2f %%)\n",dVar6);
  dVar6 = 0.0;
  if (p->nTried != 0) {
    dVar6 = ((double)p->nFilterSize * 100.0) / (double)p->nTried;
  }
  printf("Subgraphs filtered by support size          = %10d. (%6.2f %%)\n",dVar6);
  dVar6 = 0.0;
  if (p->nTried != 0) {
    dVar6 = ((double)p->nFilterRedund * 100.0) / (double)p->nTried;
  }
  printf("Subgraphs filtered by structural redundancy = %10d. (%6.2f %%)\n",dVar6);
  dVar6 = 0.0;
  if (p->nTried != 0) {
    dVar6 = ((double)p->nFilterVolume * 100.0) / (double)p->nTried;
  }
  printf("Subgraphs filtered by volume                = %10d. (%6.2f %%)\n",dVar6);
  dVar6 = 0.0;
  if (p->nTried != 0) {
    dVar6 = ((double)p->nFilterTruth * 100.0) / (double)p->nTried;
  }
  printf("Subgraphs filtered by TT redundancy         = %10d. (%6.2f %%)\n",dVar6);
  dVar6 = 0.0;
  if (p->nTried != 0) {
    dVar6 = ((double)p->nFilterError * 100.0) / (double)p->nTried;
  }
  printf("Subgraphs filtered by error                 = %10d. (%6.2f %%)\n",dVar6);
  dVar6 = 0.0;
  if (p->nTried != 0) {
    dVar6 = ((double)p->nFilterSame * 100.0) / (double)p->nTried;
  }
  printf("Subgraphs filtered by isomorphism           = %10d. (%6.2f %%)\n",dVar6);
  dVar6 = 0.0;
  if (p->nTried != 0) {
    dVar6 = ((double)p->nAdded * 100.0) / (double)p->nTried;
  }
  printf("Subgraphs added                             = %10d. (%6.2f %%)\n",dVar6);
  dVar6 = 0.0;
  if (p->nTried != 0) {
    dVar6 = ((double)p->nAddedFuncs * 100.0) / (double)p->nTried;
  }
  level = 0x6b3a16;
  printf("Functions added                             = %10d. (%6.2f %%)\n",dVar6);
  if (p->nHoleInTheWall != 0) {
    dVar6 = 0.0;
    if (p->nTried != 0) {
      dVar6 = ((double)p->nHoleInTheWall * 100.0) / (double)p->nTried;
    }
    level = 0x6b3a56;
    printf("Cuts whose logic structure has a hole       = %10d. (%6.2f %%)\n",dVar6);
  }
  p->timeOther = p->timeTotal -
                 (p->timeCheck + p->timeCanon + p->timeBuild + p->timeTruth + p->timeInsert);
  Abc_Print(level,"%s =","Runtime: Truth ");
  dVar6 = 0.0;
  if (p->timeTotal != 0) {
    dVar6 = ((double)p->timeTruth * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeTruth / 1000000.0,dVar6);
  Abc_Print(level,"%s =","Runtime: Canon ");
  dVar6 = 0.0;
  if (p->timeTotal != 0) {
    dVar6 = ((double)p->timeCanon * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeCanon / 1000000.0,dVar6);
  Abc_Print(level,"%s =","Runtime: Build ");
  dVar6 = 0.0;
  if (p->timeTotal != 0) {
    dVar6 = ((double)p->timeBuild * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeBuild / 1000000.0,dVar6);
  Abc_Print(level,"%s =","Runtime: Check ");
  dVar6 = 0.0;
  if (p->timeTotal != 0) {
    dVar6 = ((double)p->timeCheck * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeCheck / 1000000.0,dVar6);
  Abc_Print(level,"%s =","Runtime: Insert");
  dVar6 = 0.0;
  if (p->timeTotal != 0) {
    dVar6 = ((double)p->timeInsert * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeInsert / 1000000.0,dVar6);
  Abc_Print(level,"%s =","Runtime: Other ");
  dVar6 = 0.0;
  if (p->timeTotal != 0) {
    dVar6 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar6);
  Abc_Print(level,"%s =","Runtime: TOTAL ");
  dVar6 = (double)p->timeTotal;
  dVar7 = 0.0;
  if (p->timeTotal != 0) {
    dVar7 = (dVar6 * 100.0) / dVar6;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar6 / 1000000.0,dVar7);
  return;
}

Assistant:

void Lms_ManPrint( Lms_Man_t * p )
{
//    Gia_ManPrintStats( p->pGia, 0, 0 );
    printf( "Library with %d vars has %d classes and %d AIG subgraphs with %d AND nodes.\n", 
        p->nVars, Vec_MemEntryNum(p->vTtMem), p->nAdded, p->pGia ? Gia_ManAndNum(p->pGia) : 0 );

//    Lms_ManPrintFreqStats( p );
    Lms_ManPrintFuncStats( p );

    p->nAddedFuncs = Vec_MemEntryNum(p->vTtMem);
    printf( "Subgraphs tried                             = %10d. (%6.2f %%)\n", p->nTried,         !p->nTried? 0 : 100.0*p->nTried/p->nTried );
    printf( "Subgraphs filtered by support size          = %10d. (%6.2f %%)\n", p->nFilterSize,    !p->nTried? 0 : 100.0*p->nFilterSize/p->nTried );
    printf( "Subgraphs filtered by structural redundancy = %10d. (%6.2f %%)\n", p->nFilterRedund,  !p->nTried? 0 : 100.0*p->nFilterRedund/p->nTried );
    printf( "Subgraphs filtered by volume                = %10d. (%6.2f %%)\n", p->nFilterVolume,  !p->nTried? 0 : 100.0*p->nFilterVolume/p->nTried );
    printf( "Subgraphs filtered by TT redundancy         = %10d. (%6.2f %%)\n", p->nFilterTruth,   !p->nTried? 0 : 100.0*p->nFilterTruth/p->nTried );
    printf( "Subgraphs filtered by error                 = %10d. (%6.2f %%)\n", p->nFilterError,   !p->nTried? 0 : 100.0*p->nFilterError/p->nTried );
    printf( "Subgraphs filtered by isomorphism           = %10d. (%6.2f %%)\n", p->nFilterSame,    !p->nTried? 0 : 100.0*p->nFilterSame/p->nTried );
    printf( "Subgraphs added                             = %10d. (%6.2f %%)\n", p->nAdded,         !p->nTried? 0 : 100.0*p->nAdded/p->nTried );
    printf( "Functions added                             = %10d. (%6.2f %%)\n", p->nAddedFuncs,    !p->nTried? 0 : 100.0*p->nAddedFuncs/p->nTried );
    if ( p->nHoleInTheWall )
    printf( "Cuts whose logic structure has a hole       = %10d. (%6.2f %%)\n", p->nHoleInTheWall, !p->nTried? 0 : 100.0*p->nHoleInTheWall/p->nTried );

    p->timeOther = p->timeTotal - p->timeTruth - p->timeCanon - p->timeBuild - p->timeCheck - p->timeInsert;
    ABC_PRTP( "Runtime: Truth ", p->timeTruth,  p->timeTotal );
    ABC_PRTP( "Runtime: Canon ", p->timeCanon,  p->timeTotal );
    ABC_PRTP( "Runtime: Build ", p->timeBuild,  p->timeTotal );
    ABC_PRTP( "Runtime: Check ", p->timeCheck,  p->timeTotal );
    ABC_PRTP( "Runtime: Insert", p->timeInsert, p->timeTotal );
    ABC_PRTP( "Runtime: Other ", p->timeOther,  p->timeTotal );
    ABC_PRTP( "Runtime: TOTAL ", p->timeTotal,  p->timeTotal );
}